

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsPrefixTest.cpp
# Opt level: O0

bool __thiscall
DnsPrefixTest::DoOneTest(DnsPrefixTest *this,DnsStats *stats,char *test_input,char *expected)

{
  int iVar1;
  char *dnsName;
  bool bVar2;
  char *local_280;
  char *local_270;
  char *local_260;
  char *tr;
  char *te;
  char *ti;
  char teu [256];
  char tiu [256];
  bool ret;
  char *expected_local;
  char *test_input_local;
  DnsStats *stats_local;
  DnsPrefixTest *this_local;
  
  dnsName = ToUpper(this,test_input,teu + 0xf8,0x100);
  local_270 = ToUpper(this,expected,(char *)&ti,0x100);
  local_280 = DnsStats::GetZonePrefix(stats,dnsName);
  if (local_280 == (char *)0x0) {
    bVar2 = local_270 == (char *)0x0;
  }
  else if (local_270 == (char *)0x0) {
    bVar2 = false;
  }
  else {
    iVar1 = strcmp(local_280,local_270);
    bVar2 = iVar1 == 0;
  }
  if (bVar2 == false) {
    local_260 = test_input;
    if (test_input == (char *)0x0) {
      local_260 = "NULL";
    }
    if (local_270 == (char *)0x0) {
      local_270 = "NULL";
    }
    if (local_280 == (char *)0x0) {
      local_280 = "NULL";
    }
    TEST_LOG("DnsPrefixTest fails for input <%s>, expected <%s>, got <%s>\n",local_260,local_270,
             local_280);
  }
  return bVar2;
}

Assistant:

bool DnsPrefixTest::DoOneTest(DnsStats * stats, char const * test_input, char const * expected)
{
    bool ret = true;
    char tiu[256];
    char teu[256];
    char * ti;
    char * te;
    const char * tr;

    ti = ToUpper(test_input, tiu, sizeof(tiu));
    te = ToUpper(expected, teu, sizeof(teu));

    tr = stats->GetZonePrefix(ti);

    if (tr == NULL) {
        if (te != NULL) {
            ret = false;
        }
    } else if (te == NULL) {
        ret = false;
    } else if (strcmp(tr, te) != 0) {
        ret = false;
    }

    if (!ret) {
        TEST_LOG("DnsPrefixTest fails for input <%s>, expected <%s>, got <%s>\n",
            (test_input == NULL) ? "NULL" : test_input,
            (te == NULL) ? "NULL" : te,
            (tr == NULL) ? "NULL" : tr);
    }
    return ret;
}